

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O1

void sfts_head2str(sfts_t *f,char ***keys,char ***vals,char ***coms)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  char *pcVar4;
  size_t sVar5;
  char **ppcVar6;
  int nkey;
  int *status;
  char *__s2;
  bool bVar7;
  char *str;
  sfts_t *local_1b8;
  char *longstr;
  int nkeys;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  int *local_188;
  char ***local_180;
  char ***local_178;
  char ***local_170;
  char _msg [31];
  char com [81];
  char val [81];
  char skey [81];
  
  status = &f->stat;
  nkey = 0;
  local_1b8 = f;
  local_180 = keys;
  local_178 = vals;
  local_170 = coms;
  ffghsp(f->fts,&nkeys,(int *)0x0,status);
  local_190 = g_array_sized_new(1,0,8,nkeys);
  local_198 = g_array_sized_new(1,0,8,nkeys);
  local_1a0 = g_array_sized_new(1,0,8,nkeys);
  if (0 < nkeys) {
    local_188 = status;
    do {
      nkey = nkey + 1;
      ffgkyn(local_1b8->fts,nkey,skey,val,com,status);
      uVar3 = g_strchug(skey);
      pcVar4 = (char *)g_strchomp(uVar3);
      iVar1 = strcmp("CONTINUE",pcVar4);
      if (iVar1 != 0) {
        __s2 = "COMMENT";
        if (*pcVar4 != '\0') {
          __s2 = pcVar4;
        }
        iVar1 = strcmp("HISTORY",__s2);
        if (iVar1 == 0) {
          bVar7 = false;
        }
        else {
          iVar1 = strcmp("COMMENT",__s2);
          bVar7 = iVar1 != 0;
        }
        if (bVar7) {
          ffgkls(local_1b8->fts,__s2,&longstr,com,local_188);
          pcVar4 = longstr;
          sVar5 = strlen(longstr);
          if ((0x44 < (int)sVar5) && (uVar2 = (int)sVar5 - 1, pcVar4[uVar2] == '&')) {
            pcVar4[uVar2] = '\0';
          }
        }
        str = (char *)g_strdup(__s2);
        g_array_append_vals(local_190,&str,1);
        pcVar4 = val;
        if (bVar7) {
          pcVar4 = longstr;
        }
        str = (char *)g_strdup(pcVar4);
        g_array_append_vals(local_198,&str,1);
        str = (char *)g_strdup(com);
        g_array_append_vals(local_1a0,&str,1);
        status = local_188;
        if (bVar7) {
          fffree(longstr,local_188);
        }
      }
    } while (nkey < nkeys);
  }
  if (*status == 0) {
    ppcVar6 = (char **)g_array_free(local_190,0);
    *local_180 = ppcVar6;
    ppcVar6 = (char **)g_array_free(local_198,0);
    *local_178 = ppcVar6;
    ppcVar6 = (char **)g_array_free(local_1a0,0);
    *local_170 = ppcVar6;
    return;
  }
  if (local_1b8->name == (char *)0x0) {
    uVar3 = g_strdup("memory");
  }
  else {
    uVar3 = g_path_get_basename();
  }
  ffgerr(*status,_msg);
  _msg[0x1e] = '\0';
  _p2sc_msg("sfts_head2str",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
            ,0x284,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x11f8,"FITS: %s: %s",_msg,
            uVar3);
  exit(1);
}

Assistant:

void sfts_head2str(sfts_t *f, char ***keys, char ***vals, char ***coms) {
    int nkeys, *s = &f->stat;
    fits_get_hdrspace(f->fts, &nkeys, NULL, s);

    GArray *ak = g_array_sized_new(TRUE, FALSE, sizeof **keys, nkeys);
    GArray *av = g_array_sized_new(TRUE, FALSE, sizeof **vals, nkeys);
    GArray *ac = g_array_sized_new(TRUE, FALSE, sizeof **coms, nkeys);

    char *str, *longstr;
    char skey[SKEY_LEN], val[SKEY_LEN], com[SKEY_LEN];
    for (int i = 1; i <= nkeys; ++i) {
        fits_read_keyn(f->fts, i, skey, val, com, s);

        char *key = g_strstrip(skey);
        if (!strcmp("CONTINUE", key))
            continue;
        if (key[0] == 0)
            key = "COMMENT";

        int regular = strcmp("HISTORY", key) && strcmp("COMMENT", key);
        if (regular) {
            fits_read_key_longstr(f->fts, key, &longstr, com, s);
            // long strings may end in &, e.g., EUI FILE_RAW
            int len = strlen(longstr);
            if (len > 68 && longstr[len - 1] == '&')
                longstr[len - 1] = 0;
        }

        str = g_strdup(key);
        g_array_append_val(ak, str);
        str = g_strdup(regular ? longstr : val);
        g_array_append_val(av, str);
        str = g_strdup(com);
        g_array_append_val(ac, str);

        if (regular)
            fits_free_memory(longstr, s);
    }
    CHK_FTS(f);

    *keys = (char **) g_array_free(ak, FALSE);
    *vals = (char **) g_array_free(av, FALSE);
    *coms = (char **) g_array_free(ac, FALSE);
}